

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::loops_question_do(Forth *this)

{
  CAddr x;
  Forth *this_local;
  
  data(this,10);
  data(this,0xc);
  data(this,6);
  data(this,this->CellSize * 7);
  data(this,5);
  data(this,this->CellSize * 3);
  x = getDataPointer(this);
  ForthStack<unsigned_int>::push(&this->controlStackLoops,x);
  data(this,5);
  data(this,this->CellSize * 3);
  data(this,5);
  data(this,this->CellSize);
  data(this,7);
  data(this,7);
  return;
}

Assistant:

void loops_question_do() {
			data(DupDupXt);		// 0
			data(EqualsXt);		// 1
			data(zbranchXt);	// 2	
			data(CellSize * 7);	// 3 Jump 3 to 10 goto label2
			data(branchXt);		// 4
			data(3 * CellSize);	// 5 Jump 5 to 8 goto label1
			controlStackLoops.push(getDataPointer());
			data(branchXt);		// 6
			data(CellSize * 3);	// 7
			data(branchXt);		// 8  label1:
			data(CellSize);		// 9
			data(toR_Xt);		// 10 label2:
			data(toR_Xt);
		}